

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void remove_dev(lys_deviation *dev,lys_module *module,unres_schema *unres)

{
  long lVar1;
  lys_module *plVar2;
  lys_module *plVar3;
  char *pcVar4;
  size_t sVar5;
  char *ptr;
  lys_module *target_submod;
  lys_module *target_mod;
  lys_module *mod;
  uint32_t j;
  uint32_t idx;
  unres_schema *unres_local;
  lys_module *module_local;
  lys_deviation *dev_local;
  
  mod._4_4_ = 0;
  _j = unres;
  unres_local = (unres_schema *)module;
  module_local = (lys_module *)dev;
  if (dev->orig_node == (lys_node *)0x0) {
    ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
           ,0x1258);
  }
  else {
    plVar2 = lys_node_module(dev->orig_node);
    lVar1 = *(long *)(module_local->dsc + 0x30);
    lys_switch_deviation((lys_deviation *)module_local,(lys_module *)unres_local,_j);
    do {
      do {
        plVar3 = ly_ctx_get_module_iter((ly_ctx *)unres_local->item,(uint32_t *)((long)&mod + 4));
        if (plVar3 == (lys_module *)0x0) goto LAB_00194e2c;
      } while ((plVar3 == (lys_module *)unres_local) || (plVar3 == plVar2));
      mod._0_4_ = 0;
      while (((uint)mod < plVar3->deviation_size &&
             ((pcVar4 = strstr(plVar3->deviation[(uint)mod].target_name,plVar2->name),
              pcVar4 == (char *)0x0 || (sVar5 = strlen(plVar2->name), pcVar4[sVar5] != ':'))))) {
        mod._0_4_ = (uint)mod + 1;
      }
    } while (plVar3->deviation_size <= (uint)mod);
LAB_00194e2c:
    if (plVar3 == (lys_module *)0x0) {
      *(ushort *)&plVar2->field_0x40 = *(ushort *)&plVar2->field_0x40 & 0xffcf;
      *(ushort *)(lVar1 + 0x40) = *(ushort *)(lVar1 + 0x40) & 0xffcf;
    }
  }
  return;
}

Assistant:

static void
remove_dev(struct lys_deviation *dev, const struct lys_module *module, struct unres_schema *unres)
{
    uint32_t idx = 0, j;
    const struct lys_module *mod;
    struct lys_module *target_mod, *target_submod;
    const char *ptr;

    if (dev->orig_node) {
        target_mod = lys_node_module(dev->orig_node);
        target_submod = dev->orig_node->module;
    } else {
        LOGINT(module->ctx);
        return;
    }
    lys_switch_deviation(dev, module, unres);

    /* clear the deviation flag if possible */
    while ((mod = ly_ctx_get_module_iter(module->ctx, &idx))) {
        if ((mod == module) || (mod == target_mod)) {
            continue;
        }

        for (j = 0; j < mod->deviation_size; ++j) {
            ptr = strstr(mod->deviation[j].target_name, target_mod->name);
            if (ptr && (ptr[strlen(target_mod->name)] == ':')) {
                /* some other module deviation targets the inspected module, flag remains */
                break;
            }
        }

        if (j < mod->deviation_size) {
            break;
        }
    }

    if (!mod) {
        target_mod->deviated = 0;    /* main module */
        target_submod->deviated = 0; /* possible submodule */
    }
}